

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O0

UINT64 GetDecodedSizeOfBuf(UINT8 *EncodedData)

{
  int local_1c;
  UINT64 UStack_18;
  INT32 Index;
  UINT64 DecodedSize;
  UINT8 *EncodedData_local;
  
  UStack_18 = 0;
  for (local_1c = 0xc; 4 < local_1c; local_1c = local_1c + -1) {
    UStack_18 = LShiftU64(UStack_18,8);
    UStack_18 = UStack_18 + EncodedData[local_1c];
  }
  return UStack_18;
}

Assistant:

UINT64
GetDecodedSizeOfBuf (
    UINT8 *EncodedData
    )
{
    UINT64 DecodedSize;
    INT32  Index;

    // Parse header
    DecodedSize = 0;
    for (Index = LZMA_PROPS_SIZE + 7; Index >= LZMA_PROPS_SIZE; Index--)
        DecodedSize = LShiftU64(DecodedSize, 8) + EncodedData[Index];

    return DecodedSize;
}